

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integerCoding.cpp
# Opt level: O0

size_t tinyusdz::anon_unknown_0::_GetEncodedBufferSize<long>(size_t numInts)

{
  undefined8 local_18;
  size_t numInts_local;
  
  if (numInts == 0) {
    local_18 = 0;
  }
  else {
    local_18 = (numInts * 2 + 7 >> 3) + 8 + numInts * 8;
  }
  return local_18;
}

Assistant:

constexpr size_t
_GetEncodedBufferSize(size_t numInts)
{
    // Calculate encoded integer size.
    return numInts ?
        /* commonValue */ (sizeof(Int)) +
        /* numCodesBytes */ ((numInts * 2 + 7) / 8) +
        /* maxIntBytes */ (numInts * sizeof(Int))
        : 0;
}